

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwFunctions.cpp
# Opt level: O1

void eglw::initCore(Functions *dst,FunctionLoader *loader)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglBindAPI");
  dst->bindAPI = (eglBindAPIFunc)CONCAT44(extraout_var,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglBindTexImage");
  dst->bindTexImage = (eglBindTexImageFunc)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglChooseConfig");
  dst->chooseConfig = (eglChooseConfigFunc)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglClientWaitSync");
  dst->clientWaitSync = (eglClientWaitSyncFunc)CONCAT44(extraout_var_02,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCopyBuffers");
  dst->copyBuffers = (eglCopyBuffersFunc)CONCAT44(extraout_var_03,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreateContext");
  dst->createContext = (eglCreateContextFunc)CONCAT44(extraout_var_04,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreateImage");
  dst->createImage = (eglCreateImageFunc)CONCAT44(extraout_var_05,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreatePbufferFromClientBuffer");
  dst->createPbufferFromClientBuffer =
       (eglCreatePbufferFromClientBufferFunc)CONCAT44(extraout_var_06,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreatePbufferSurface");
  dst->createPbufferSurface = (eglCreatePbufferSurfaceFunc)CONCAT44(extraout_var_07,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreatePixmapSurface");
  dst->createPixmapSurface = (eglCreatePixmapSurfaceFunc)CONCAT44(extraout_var_08,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreatePlatformPixmapSurface");
  dst->createPlatformPixmapSurface =
       (eglCreatePlatformPixmapSurfaceFunc)CONCAT44(extraout_var_09,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreatePlatformWindowSurface");
  dst->createPlatformWindowSurface =
       (eglCreatePlatformWindowSurfaceFunc)CONCAT44(extraout_var_10,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreateSync");
  dst->createSync = (eglCreateSyncFunc)CONCAT44(extraout_var_11,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreateWindowSurface");
  dst->createWindowSurface = (eglCreateWindowSurfaceFunc)CONCAT44(extraout_var_12,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglDestroyContext");
  dst->destroyContext = (eglDestroyContextFunc)CONCAT44(extraout_var_13,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglDestroyImage");
  dst->destroyImage = (eglDestroyImageFunc)CONCAT44(extraout_var_14,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglDestroySurface");
  dst->destroySurface = (eglDestroySurfaceFunc)CONCAT44(extraout_var_15,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglDestroySync");
  dst->destroySync = (eglDestroySyncFunc)CONCAT44(extraout_var_16,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetConfigAttrib");
  dst->getConfigAttrib = (eglGetConfigAttribFunc)CONCAT44(extraout_var_17,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetConfigs");
  dst->getConfigs = (eglGetConfigsFunc)CONCAT44(extraout_var_18,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetCurrentContext");
  dst->getCurrentContext = (eglGetCurrentContextFunc)CONCAT44(extraout_var_19,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetCurrentDisplay");
  dst->getCurrentDisplay = (eglGetCurrentDisplayFunc)CONCAT44(extraout_var_20,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetCurrentSurface");
  dst->getCurrentSurface = (eglGetCurrentSurfaceFunc)CONCAT44(extraout_var_21,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetDisplay");
  dst->getDisplay = (eglGetDisplayFunc)CONCAT44(extraout_var_22,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetError");
  dst->getError = (eglGetErrorFunc)CONCAT44(extraout_var_23,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetPlatformDisplay");
  dst->getPlatformDisplay = (eglGetPlatformDisplayFunc)CONCAT44(extraout_var_24,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetProcAddress");
  dst->getProcAddress = (eglGetProcAddressFunc)CONCAT44(extraout_var_25,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetSyncAttrib");
  dst->getSyncAttrib = (eglGetSyncAttribFunc)CONCAT44(extraout_var_26,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglInitialize");
  dst->initialize = (eglInitializeFunc)CONCAT44(extraout_var_27,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglMakeCurrent");
  dst->makeCurrent = (eglMakeCurrentFunc)CONCAT44(extraout_var_28,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglQueryAPI");
  dst->queryAPI = (eglQueryAPIFunc)CONCAT44(extraout_var_29,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglQueryContext");
  dst->queryContext = (eglQueryContextFunc)CONCAT44(extraout_var_30,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglQueryString");
  dst->queryString = (eglQueryStringFunc)CONCAT44(extraout_var_31,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglQuerySurface");
  dst->querySurface = (eglQuerySurfaceFunc)CONCAT44(extraout_var_32,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglReleaseTexImage");
  dst->releaseTexImage = (eglReleaseTexImageFunc)CONCAT44(extraout_var_33,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglReleaseThread");
  dst->releaseThread = (eglReleaseThreadFunc)CONCAT44(extraout_var_34,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglSurfaceAttrib");
  dst->surfaceAttrib = (eglSurfaceAttribFunc)CONCAT44(extraout_var_35,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglSwapBuffers");
  dst->swapBuffers = (eglSwapBuffersFunc)CONCAT44(extraout_var_36,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglSwapInterval");
  dst->swapInterval = (eglSwapIntervalFunc)CONCAT44(extraout_var_37,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglTerminate");
  dst->terminate = (eglTerminateFunc)CONCAT44(extraout_var_38,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglWaitClient");
  dst->waitClient = (eglWaitClientFunc)CONCAT44(extraout_var_39,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglWaitGL");
  dst->waitGL = (eglWaitGLFunc)CONCAT44(extraout_var_40,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglWaitNative");
  dst->waitNative = (eglWaitNativeFunc)CONCAT44(extraout_var_41,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglWaitSync");
  dst->waitSync = (eglWaitSyncFunc)CONCAT44(extraout_var_42,iVar1);
  return;
}

Assistant:

void initCore (Functions* dst, const FunctionLoader* loader)
{
#include "eglwInitCore.inl"
}